

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O0

void __thiscall CSR::initializeWithMatirx1(CSR *this,Matrix *m)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  int *piVar7;
  double *__s;
  ostream *poVar8;
  rep_conflict rVar9;
  double durationSym;
  rep_conflict local_58;
  rep_conflict local_50;
  int local_48;
  int local_44;
  int j;
  int i;
  duration<double,_std::ratio<1L,_1L>_> local_38;
  duration<double,_std::ratio<1L,_1L>_> elapsed_seconds;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  int s;
  int c;
  Matrix *m_local;
  CSR *this_local;
  
  start.__d.__r._4_4_ = 0;
  this->row = m->rowNo;
  this->col = m->colNo;
  iVar5 = Matrix::getNonzero(m);
  this->nonzero = iVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(this->row + 1);
  uVar6 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar7 = (int *)operator_new__(uVar6);
  memset(piVar7,0,uVar6);
  this->ptr = piVar7;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->nonzero;
  uVar6 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar7 = (int *)operator_new__(uVar6);
  memset(piVar7,0,uVar6);
  this->idx = piVar7;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->nonzero;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  __s = (double *)operator_new__(uVar6);
  memset(__s,0,uVar6);
  this->val = __s;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)this->row;
  uVar6 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar7 = (int *)operator_new__(uVar6);
  this->nzRow = piVar7;
  *this->ptr = 0;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&end);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&elapsed_seconds);
  _j = std::chrono::_V2::system_clock::now();
  for (local_44 = 0; local_44 < this->row; local_44 = local_44 + 1) {
    start.__d.__r._0_4_ = 0;
    for (local_48 = 0; local_48 < this->col; local_48 = local_48 + 1) {
      if ((m->array[local_44][local_48] != 0.0) || (NAN(m->array[local_44][local_48]))) {
        this->val[start.__d.__r._4_4_] = m->array[local_44][local_48];
        this->idx[start.__d.__r._4_4_] = local_48;
        start.__d.__r._4_4_ = start.__d.__r._4_4_ + 1;
        start.__d.__r._0_4_ = (int)start.__d.__r + 1;
      }
    }
    this->nzRow[local_44] = (int)start.__d.__r;
    this->ptr[local_44 + 1] = this->ptr[local_44] + this->nzRow[local_44];
  }
  end.__d.__r = (duration)(duration)_j;
  local_50 = (rep_conflict)std::chrono::_V2::system_clock::now();
  elapsed_seconds.__r = local_50;
  durationSym = (double)std::chrono::operator-
                                  ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&elapsed_seconds,&end);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_58,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym);
  local_38.__r = local_58;
  rVar9 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_38);
  poVar8 = std::operator<<((ostream *)&std::cout,"execution time (initialize CSR):");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,rVar9);
  std::operator<<(poVar8,"\n");
  if (this->nzRow != (int *)0x0) {
    operator_delete__(this->nzRow);
  }
  return;
}

Assistant:

void CSR::initializeWithMatirx1(Matrix *m)//Private
{
    int c = 0;
    int s;
    row = m->rowNo;
    col = m->colNo;
    nonzero = m->getNonzero();

    ptr = new int[row + 1]();
    idx = new int[nonzero]();
    val = new double[nonzero]();
    nzRow = new int[row];
    ptr[0] = 0;

    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    start = std::chrono::system_clock::now();
    for (int i = 0; i < row; i++)
    {
        s = 0;
        for (int j = 0; j < col; j++)
        {
            if (m->array[i][j] != 0)
            {
                val[c] = m->array[i][j];
                idx[c] = j;
                c++;
                s++;
            }
        }
        nzRow[i] = s;
        ptr[i+1] = ptr[i]+nzRow[i];
    }

    end = std::chrono::system_clock::now();
    elapsed_seconds = end - start;
    double durationSym = elapsed_seconds.count();
    cout << "execution time (initialize CSR):" << durationSym << "\n";

    delete []nzRow;
}